

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O0

void __thiscall
Omega_h::MetricEdgeLengths<3,_1>::MetricEdgeLengths(MetricEdgeLengths<3,_1> *this,Mesh *mesh)

{
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [24];
  Mesh *mesh_local;
  MetricEdgeLengths<3,_3> *this_local;
  
  local_28._16_8_ = mesh;
  mesh_local = (Mesh *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"metric",&local_49);
  Omega_h::Mesh::get_array<double>((Mesh *)local_28,(Int)mesh,(string *)0x0);
  MetricEdgeLengths(this,mesh,(Reals *)local_28);
  Read<double>::~Read((Read<double> *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh)
      : MetricEdgeLengths(mesh, mesh->get_array<Real>(VERT, "metric")) {}